

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O1

void __thiscall
agge::tests::LayoutTests::LongWordsAreEmergentlyBrokenOnWidthLimit(LayoutTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  void *pvVar6;
  wrap limiter;
  wrap limiter_00;
  glyph_index_t *pgVar7;
  long lVar8;
  pointer ptVar9;
  uint *puVar10;
  const_iterator i;
  factory_ptr f;
  layout l;
  char_to_index indices [3];
  int local_570 [2];
  undefined1 local_568 [4];
  float fStack_564;
  float local_560;
  undefined4 uStack_55c;
  undefined1 local_558 [16];
  iterator local_548;
  positioned_glyph *ppStack_540;
  bool local_538;
  undefined1 local_530 [4];
  float fStack_52c;
  float fStack_528;
  undefined4 uStack_524;
  vector_r local_520;
  pointer ppStack_518;
  iterator local_510;
  positioned_glyph *ppStack_508;
  bool local_500;
  int local_4f8 [2];
  font_factory *local_4f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4e8;
  undefined1 local_4e0 [4];
  float fStack_4dc;
  float fStack_4d8;
  undefined1 local_4d0 [24];
  vector<int,_std::allocator<int>_> local_4b8;
  vector<int,_std::allocator<int>_> local_4a0;
  int local_488 [2];
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_480;
  undefined1 local_468 [24];
  vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> avStack_450 [8];
  undefined1 local_448 [24];
  _Alloc_hider local_430;
  char local_420 [32];
  vector<int,_std::allocator<int>_> local_400;
  vector<int,_std::allocator<int>_> local_3e8;
  vector<int,_std::allocator<int>_> local_3d0;
  vector<int,_std::allocator<int>_> local_3b8;
  vector<int,_std::allocator<int>_> local_3a0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_388;
  vector<int,_std::allocator<int>_> local_370;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_358;
  vector<int,_std::allocator<int>_> local_340;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_328;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_310;
  string local_2f8;
  vector<int,_std::allocator<int>_> local_2d8;
  vector<int,_std::allocator<int>_> local_2b8;
  vector<int,_std::allocator<int>_> local_298;
  vector<int,_std::allocator<int>_> local_278;
  vector<int,_std::allocator<int>_> local_258;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_238;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_220;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  uint uStack_1f4;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_1f0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1d8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1c0;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  uint uStack_194;
  ref_text_line local_190;
  ref_text_line local_168;
  ref_text_line local_140;
  layout local_118;
  glyph local_c8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_c8.metrics.dx = 3.2114266979681e-322;
  local_c8.metrics.dy = 2.1219958235736e-314;
  local_c8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000043;
  local_c8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = 0;
  uStack_88 = 0;
  local_80 = 0x4000000000000000;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0x4008000000000000;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  create_single_font_factory<3ul,3ul>
            ((LayoutTests *)&local_4f0,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [3])&local_c8);
  local_118._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_118._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_118._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118._glyphs._limit = (positioned_glyph *)0x0;
  local_118._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._glyphs._begin = (positioned_glyph *)0x0;
  local_118._glyphs._end = (positioned_glyph *)0x0;
  local_118._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _local_568 = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"ABCABCABC","");
  R((richtext_t *)local_468,(string *)local_568);
  local_1a8 = 0x40c00000;
  uStack_1a4 = 0;
  uStack_1a0 = 0;
  uStack_19c = 0;
  uStack_198 = 0;
  uStack_194 = uStack_194 & 0xffffff00;
  lVar8 = (ulong)uStack_194 << 0x20;
  limiter._sow.next = (int)lVar8;
  limiter._previous_space = (bool)(char)((ulong)lVar8 >> 0x20);
  limiter._21_3_ = (int3)((ulong)lVar8 >> 0x28);
  limiter._limit = 6.0;
  limiter._eow.extent = 0.0;
  limiter._eow.next = 0;
  limiter._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&local_118,(richtext_t *)local_468,limiter,local_4f0);
  if (local_430._M_p != local_420) {
    operator_delete(local_430._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector((vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
             *)local_448);
  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
    operator_delete((void *)local_468._0_8_);
  }
  if (_local_568 != local_558) {
    operator_delete(_local_568);
  }
  peVar2 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_4f8[1] = 1;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_258,
             (iterator)
             local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_4f8 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&local_340,&local_258);
  local_570[1] = 2;
  if (local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_340,
               (iterator)
               local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_570 + 1);
  }
  else {
    *local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_4a0,&local_340);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_448._0_8_ = (pointer)0x0;
  local_448._8_8_ = (pointer)0x0;
  local_468._16_8_ = 0;
  avStack_450 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_448[0x10] = false;
  local_468._0_8_ = peVar2;
  local_468._8_8_ = p_Var3;
  if (local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar10 = (uint *)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      local_568 = (undefined1  [4])*puVar10;
      fStack_564 = 0.0;
      local_560 = 0.0;
      if (local_448._0_8_ == local_448._8_8_) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_468 + 0x18),(iterator)local_448._0_8_,(positioned_glyph *)local_568);
      }
      else {
        ((vector_r *)(local_448._0_8_ + 4))->dy = 0.0;
        *(ulong *)local_448._0_8_ = (ulong)(uint)local_568;
        local_448._0_8_ = local_448._0_8_ + 0xc;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 !=
             (uint *)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_328,1,(value_type *)local_468,(allocator_type *)local_568);
  ref_text_line::ref_text_line(&local_140,0.0,10.0,6.0,&local_328);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_1d8,1,&local_140,(allocator_type *)local_568);
  peVar2 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_488[1] = 1;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_278,
             (iterator)
             local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_488 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&local_370,&local_278);
  local_570[0] = 2;
  if (local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_370,
               (iterator)
               local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_570);
  }
  else {
    *local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_4b8,&local_370);
  local_568 = SUB84(peVar2,0);
  fStack_564 = (float)((ulong)peVar2 >> 0x20);
  local_560 = SUB84(p_Var4,0);
  uStack_55c = (undefined4)((ulong)p_Var4 >> 0x20);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_548._M_current = (positioned_glyph *)0x0;
  ppStack_540 = (positioned_glyph *)0x0;
  local_558._0_8_ = 0;
  local_558._8_8_ = (void *)0x0;
  local_538 = false;
  if (local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar10 = (uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      local_530 = (undefined1  [4])*puVar10;
      fStack_52c = 0.0;
      fStack_528 = 0.0;
      if (local_548._M_current == ppStack_540) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_558 + 8),local_548,(positioned_glyph *)local_530);
      }
      else {
        ((local_548._M_current)->d).dy = 0.0;
        (local_548._M_current)->index = (int)(ulong)(uint)local_530;
        ((local_548._M_current)->d).dx = (float)(int)((ulong)(uint)local_530 >> 0x20);
        local_548._M_current = local_548._M_current + 1;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 !=
             (uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_358,1,(value_type *)local_568,(allocator_type *)local_530);
  ref_text_line::ref_text_line(&local_168,0.0,24.0,6.0,&local_358);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_1d8,&local_168);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_1c0,&local_1d8);
  peVar2 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_4f8[0] = 1;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_298,
             (iterator)
             local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_4f8);
  std::vector<int,_std::allocator<int>_>::vector(&local_3a0,&local_298);
  local_488[0] = 2;
  if (local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3a0,
               (iterator)
               local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_488);
  }
  else {
    *local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_480,&local_3a0);
  local_530 = SUB84(peVar2,0);
  fStack_52c = (float)((ulong)peVar2 >> 0x20);
  fStack_528 = SUB84(p_Var5,0);
  uStack_524 = (undefined4)((ulong)p_Var5 >> 0x20);
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  local_510._M_current = (positioned_glyph *)0x0;
  ppStack_508 = (positioned_glyph *)0x0;
  local_520.dx = 0.0;
  local_520.dy = 0.0;
  ppStack_518 = (pointer)0x0;
  local_500 = false;
  if (local_480.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_480.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ptVar9 = local_480.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl
             .super__Vector_impl_data._M_start;
    do {
      local_4e0 = SUB84((ptVar9->
                        super_range<const_std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>_>
                        ).begin_index,0);
      fStack_4dc = 0.0;
      fStack_4d8 = 0.0;
      if (local_510._M_current == ppStack_508) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   &ppStack_518,local_510,(positioned_glyph *)local_4e0);
      }
      else {
        ((local_510._M_current)->d).dy = 0.0;
        (local_510._M_current)->index = (int)(ulong)(uint)local_4e0;
        ((local_510._M_current)->d).dx = (float)(int)((ulong)(uint)local_4e0 >> 0x20);
        local_510._M_current = local_510._M_current + 1;
      }
      ptVar9 = (pointer)((long)&(ptVar9->
                                super_range<const_std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>_>
                                ).begin_index + 4);
    } while (ptVar9 != local_480.
                       super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl
                       .super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_388,1,(value_type *)local_530,(allocator_type *)local_4e0);
  ref_text_line::ref_text_line(&local_190,0.0,38.0,6.0,&local_388);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_1c0,&local_190);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_310,&local_1c0);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_1f0,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_118._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_118._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_4e0);
  paVar1 = &local_2f8.field_2;
  local_2f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_4e0,&local_2f8,0x19f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_310,&local_1f0,(LocationInfo *)local_4e0);
  if ((undefined1 *)CONCAT44(fStack_4dc,local_4e0) != local_4d0) {
    operator_delete((undefined1 *)CONCAT44(fStack_4dc,local_4e0));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((void *)CONCAT44(local_1f0.
                       super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl
                       .super__Vector_impl_data._M_start._4_4_,
                       local_1f0.
                       super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl
                       .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_1f0.
                                     super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_1f0.
                                     super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_310);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_190._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_388);
  if (ppStack_518 != (pointer)0x0) {
    operator_delete(ppStack_518);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_524,fStack_528) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_524,fStack_528));
  }
  if (local_480.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_480.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1c0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_168._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_358);
  if ((void *)local_558._8_8_ != (void *)0x0) {
    operator_delete((void *)local_558._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_55c,local_560) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_55c,local_560));
  }
  if ((uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1d8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_140._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_328);
  if (avStack_450 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_450);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_);
  }
  if ((uint *)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  _local_568 = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"ABCABCABC","");
  R((richtext_t *)local_468,(string *)local_568);
  local_208 = 0x41000000;
  uStack_204 = 0;
  uStack_200 = 0;
  uStack_1fc = 0;
  uStack_1f8 = 0;
  uStack_1f4 = uStack_1f4 & 0xffffff00;
  lVar8 = (ulong)uStack_1f4 << 0x20;
  limiter_00._sow.next = (int)lVar8;
  limiter_00._previous_space = (bool)(char)((ulong)lVar8 >> 0x20);
  limiter_00._21_3_ = (int3)((ulong)lVar8 >> 0x28);
  limiter_00._limit = 8.0;
  limiter_00._eow.extent = 0.0;
  limiter_00._eow.next = 0;
  limiter_00._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&local_118,(richtext_t *)local_468,limiter_00,local_4f0);
  if (local_430._M_p != local_420) {
    operator_delete(local_430._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector((vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
             *)local_448);
  if ((element_type *)local_468._0_8_ != (element_type *)(local_468 + 0x10)) {
    operator_delete((void *)local_468._0_8_);
  }
  if (_local_568 != local_558) {
    operator_delete(_local_568);
  }
  peVar2 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_1f0.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_2b8,
             (iterator)
             local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,(int *)&local_1f0);
  std::vector<int,_std::allocator<int>_>::vector(&local_3d0,&local_2b8);
  local_4f8[1] = 2;
  if (local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3d0,
               (iterator)
               local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4f8 + 1);
  }
  else {
    *local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_3b8,&local_3d0);
  local_570[1] = 0;
  if (local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3b8,
               (iterator)
               local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_570 + 1);
  }
  else {
    *local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_4a0,&local_3b8);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_448._0_8_ = (pointer)0x0;
  local_448._8_8_ = (pointer)0x0;
  local_468._16_8_ = 0;
  avStack_450 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_448[0x10] = false;
  local_468._0_8_ = peVar2;
  local_468._8_8_ = p_Var3;
  if (local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar10 = (uint *)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      local_568 = (undefined1  [4])*puVar10;
      fStack_564 = 0.0;
      local_560 = 0.0;
      if (local_448._0_8_ == local_448._8_8_) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_468 + 0x18),(iterator)local_448._0_8_,(positioned_glyph *)local_568);
      }
      else {
        ((vector_r *)(local_448._0_8_ + 4))->dy = 0.0;
        *(ulong *)local_448._0_8_ = (ulong)(uint)local_568;
        local_448._0_8_ = local_448._0_8_ + 0xc;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 !=
             (uint *)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_328,1,(value_type *)local_468,(allocator_type *)local_568);
  ref_text_line::ref_text_line(&local_140,0.0,10.0,7.0,&local_328);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_238,1,&local_140,(allocator_type *)local_568);
  peVar2 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 1;
  local_488[1] = 2;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_2d8,
             (iterator)
             local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_488 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&local_400,&local_2d8);
  local_570[0] = 0;
  if (local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_400,
               (iterator)
               local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_570);
  }
  else {
    *local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_3e8,&local_400);
  local_4f8[0] = 1;
  if (local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3e8,
               (iterator)
               local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4f8);
  }
  else {
    *local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_4b8,&local_3e8);
  local_568 = SUB84(peVar2,0);
  fStack_564 = (float)((ulong)peVar2 >> 0x20);
  local_560 = SUB84(p_Var4,0);
  uStack_55c = (undefined4)((ulong)p_Var4 >> 0x20);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_548._M_current = (positioned_glyph *)0x0;
  ppStack_540 = (positioned_glyph *)0x0;
  local_558._0_8_ = 0;
  local_558._8_8_ = (void *)0x0;
  local_538 = false;
  if (local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar10 = (uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      local_530 = (undefined1  [4])*puVar10;
      fStack_52c = 0.0;
      fStack_528 = 0.0;
      if (local_548._M_current == ppStack_540) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_558 + 8),local_548,(positioned_glyph *)local_530);
      }
      else {
        ((local_548._M_current)->d).dy = 0.0;
        (local_548._M_current)->index = (int)(ulong)(uint)local_530;
        ((local_548._M_current)->d).dx = (float)(int)((ulong)(uint)local_530 >> 0x20);
        local_548._M_current = local_548._M_current + 1;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 !=
             (uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_358,1,(value_type *)local_568,(allocator_type *)local_530);
  ref_text_line::ref_text_line(&local_168,0.0,24.0,8.0,&local_358);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_238,&local_168);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_220,&local_238);
  peVar2 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (local_4f0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  pgVar7 = (glyph_index_t *)operator_new(4);
  *pgVar7 = 2;
  local_530 = SUB84(peVar2,0);
  fStack_52c = (float)((ulong)peVar2 >> 0x20);
  fStack_528 = SUB84(p_Var5,0);
  uStack_524 = (undefined4)((ulong)p_Var5 >> 0x20);
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  local_510._M_current = (pointer)0x0;
  ppStack_508 = (pointer)0x0;
  local_520.dx = 0.0;
  local_520.dy = 0.0;
  ppStack_518 = (pointer)0x0;
  local_500 = false;
  local_4e0 = (undefined1  [4])*pgVar7;
  fStack_4dc = 0.0;
  fStack_4d8 = 0.0;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  _M_realloc_insert<agge::positioned_glyph_const&>
            ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)&ppStack_518,
             (iterator)0x0,(positioned_glyph *)local_4e0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_388,1,(value_type *)local_530,(allocator_type *)local_4e0);
  ref_text_line::ref_text_line(&local_190,0.0,38.0,3.0,&local_388);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_220,&local_190);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_310,&local_220);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_480,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_118._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_118._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_4e0);
  local_2f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_4e0,&local_2f8,0x1a9);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_310,&local_480,(LocationInfo *)local_4e0);
  if ((undefined1 *)CONCAT44(fStack_4dc,local_4e0) != local_4d0) {
    operator_delete((undefined1 *)CONCAT44(fStack_4dc,local_4e0));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_480.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_480.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_310);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_190._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_388);
  if (ppStack_518 != (pointer)0x0) {
    operator_delete(ppStack_518);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_524,fStack_528) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_524,fStack_528));
  }
  operator_delete(pgVar7);
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_220);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_168._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_358);
  if ((void *)local_558._8_8_ != (void *)0x0) {
    operator_delete((void *)local_558._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_55c,local_560) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_55c,local_560));
  }
  if ((uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_238);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_140._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_328);
  if (avStack_450 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_450);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_);
  }
  if ((uint *)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (local_118._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_118._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_118._glyph_runs);
  if (local_118._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_118._glyphs._begin);
  }
  if (local_4e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e8);
  }
  lVar8 = 0x60;
  do {
    pvVar6 = *(void **)((long)&local_c8.outline.
                               super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar8);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6);
    }
    lVar8 = lVar8 + -0x28;
  } while (lVar8 != -0x18);
  return;
}

Assistant:

test( LongWordsAreEmergentlyBrokenOnWidthLimit )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, { L'B', 1 }, { L'C', 2 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 1, 0 } },
					{ { 2, 0 } },
					{ { 3, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout::const_iterator gr;
				layout l;

				// ACT
				l.process(R("ABCABCABC"), limit::wrap(6.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2))
					+ ref_text_line(0.0f, 24.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2))
					+ ref_text_line(0.0f, 38.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2)),
					mkvector(l.begin(), l.end()));

				// ACT
				l.process(R("ABCABCABC"), limit::wrap(8.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 7.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2 + 0))
					+ ref_text_line(0.0f, 24.0f, 8.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 0 + 1))
					+ ref_text_line(0.0f, 38.0f, 3.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 2)),
					mkvector(l.begin(), l.end()));
			}